

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::erase
          (Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *this,Bucket bucket)

{
  Span *pSVar1;
  size_t sVar2;
  Span *pSVar3;
  Span *pSVar4;
  Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *this_00;
  ulong uVar5;
  size_t bucket_00;
  size_t to;
  Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *this_01;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  to = bucket_00;
  do {
    do {
      bucket_00 = bucket_00 + 1;
      if (bucket_00 == 0x80) {
        this_00 = this_00 + 1;
        if (((long)this_00 - (long)this->spans >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
            == 0) {
          this_00 = this->spans;
        }
        bucket_00 = 0;
      }
      if ((ulong)this_00->offsets[bucket_00] == 0xff) {
        return;
      }
      sVar2 = calculateHash<QtFontFallbacksCacheKey>
                        ((QtFontFallbacksCacheKey *)
                         (this_00->entries[this_00->offsets[bucket_00]].storage.data + 0x10),
                         this->seed);
      pSVar1 = this->spans;
      uVar5 = this->numBuckets - 1 & sVar2;
      pSVar3 = pSVar1 + (uVar5 >> 7);
      uVar5 = (ulong)((uint)uVar5 & 0x7f);
    } while (uVar5 == bucket_00 && pSVar3 == this_00);
    do {
      if (uVar5 == to && pSVar3 == this_01) {
        if (this_00 == this_01) {
          this_01->offsets[to] = this_01->offsets[bucket_00];
          this_01->offsets[bucket_00] = 0xff;
          this_01 = this_00;
          to = bucket_00;
        }
        else {
          Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::moveFromSpan
                    (this_01,this_00,bucket_00,to);
          this_01 = this_00;
          to = bucket_00;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      if (uVar5 == 0x80) {
        pSVar4 = pSVar3 + 1;
        pSVar3 = pSVar1;
        if (((long)pSVar4 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) != 0)
        {
          pSVar3 = pSVar4;
        }
        uVar5 = 0;
      }
    } while ((pSVar3 != this_00) || (uVar5 != bucket_00));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }